

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_key.c
# Opt level: O3

void get_cmp(char **pt,char *kvalue,kwdtyp *ktype,unsigned_long *stat)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  ushort **ppuVar4;
  unsigned_long *puVar5;
  size_t __n;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  kwdtyp itype;
  kwdtyp rtype;
  unsigned_long ti;
  unsigned_long tr;
  char temp [81];
  char card [81];
  unsigned_long *local_138;
  char *local_130;
  kwdtyp local_128;
  kwdtyp local_124;
  kwdtyp *local_120;
  char *local_118;
  char *local_110;
  char **local_108;
  unsigned_long *local_100;
  unsigned_long local_f8;
  unsigned_long local_f0;
  char local_e8 [96];
  char local_88;
  char local_87 [79];
  undefined1 local_38;
  
  pcVar6 = (char *)0x0;
  local_f0 = 0;
  local_f8 = 0;
  puVar5 = stat;
  local_110 = kvalue;
  strcpy(&local_88,*pt);
  local_38 = 0;
  *ktype = CMI_KEY;
  local_e8[0] = '\0';
  bVar2 = false;
  local_130 = local_87;
  for (pcVar8 = local_130; (cVar1 = *pcVar8, cVar1 != '\0' && (cVar1 != '/')); pcVar8 = pcVar8 + 1)
  {
    if (cVar1 == ')') {
      bVar3 = false;
      pcVar7 = pcVar8;
      pcVar8 = pcVar8 + 1;
      goto LAB_001106c2;
    }
    if (cVar1 != ',' || bVar2) {
      if (cVar1 == ',') {
        *(byte *)stat = (byte)*stat | 0x40;
      }
    }
    else {
      puVar5 = (unsigned_long *)(pcVar8 + 1);
      bVar2 = true;
      pcVar6 = pcVar8;
    }
  }
  bVar3 = true;
  pcVar7 = (char *)0x0;
LAB_001106c2:
  if (!bVar2) {
    *(byte *)stat = (byte)*stat | 0x20;
  }
  local_138 = puVar5;
  local_120 = ktype;
  local_118 = pcVar6;
  local_108 = pt;
  local_100 = stat;
  if (bVar3) {
    *(byte *)stat = (byte)*stat | 0x10;
    ppuVar4 = __ctype_b_loc();
    pcVar7 = pcVar8 + 1;
    do {
      pcVar6 = pcVar7 + -2;
      pcVar7 = pcVar7 + -1;
    } while ((*(byte *)((long)*ppuVar4 + (long)*pcVar6 * 2 + 1) & 0x20) != 0);
  }
  else {
    ppuVar4 = __ctype_b_loc();
  }
  pcVar6 = local_110;
  __n = (size_t)((int)pcVar7 - (int)&local_88);
  strncpy(local_110,&local_88,__n);
  puVar5 = local_100;
  pcVar6[__n] = '\0';
  pcVar6 = pcVar8 + ~(ulong)&local_88;
  do {
    cVar1 = *pcVar8;
    pcVar6 = pcVar6 + 1;
    if ((long)cVar1 == 0) break;
    pcVar8 = pcVar8 + 1;
  } while (((*ppuVar4)[cVar1] & 0x2000) != 0);
  *local_108 = *local_108 + (long)pcVar6;
  *local_118 = '\0';
  *pcVar7 = '\0';
  local_130 = local_130 + -1;
  do {
    pcVar6 = local_130 + 1;
    local_130 = local_130 + 1;
    if ((long)*pcVar6 == 0) break;
  } while (((*ppuVar4)[*pcVar6] & 0x2000) != 0);
  local_138 = (unsigned_long *)((long)local_138 + -1);
  do {
    pcVar6 = (char *)((long)local_138 + 1);
    local_138 = (unsigned_long *)((long)local_138 + 1);
    if ((long)*pcVar6 == 0) break;
  } while (((*ppuVar4)[*pcVar6] & 0x2000) != 0);
  local_e8[0] = '\0';
  get_num(&local_130,local_e8,&local_124,&local_f0);
  if (local_f0 != 0) {
    *(byte *)puVar5 = (byte)*puVar5 | 0x80;
  }
  local_e8[0] = '\0';
  get_num((char **)&local_138,local_e8,&local_128,&local_f8);
  if (local_f8 != 0) {
    *(byte *)((long)puVar5 + 1) = *(byte *)((long)puVar5 + 1) | 1;
  }
  if ((local_124 == FLT_KEY) || (local_128 == FLT_KEY)) {
    *local_120 = CMF_KEY;
  }
  return;
}

Assistant:

void get_cmp(char **pt,     		/* card string */
	    char *kvalue,		/* comment string */
	    kwdtyp *ktype, 
	    unsigned long *stat		/* error number */
	   )
{
    char *p;
    char **pp;
    char *pr_beg;			/* end of real part */
    char *pr_end=0;			/* end of real part */
    char *pi_beg;			/* beginning of the imaginay part */
    char *pi_end=0;			/* end of real part */
    int  nchar;
    int set_comm = 0;
    int set_paren = 0;

    unsigned long tr  = 0;
    unsigned long ti = 0;
    kwdtyp rtype, itype;
    char temp[FLEN_CARD];
    char card[FLEN_CARD];

  
    strcpy(card,*pt);			/* save the original */
    card[FLEN_CARD-1] = '\0'; 

    *ktype = CMI_KEY;			/* default: integer complex */
    p = card + 1;
    pr_beg = p;

    temp[0] = '\0';
    while(*p != '\0' && *p != '/') { 
	if(*p == ')') { 
	    set_paren = 1; 
	    pi_end = p;
	    p++;
	    break;
        }
	if(!set_comm && *p == ',') { 
	    set_comm = 1;
	    pr_end = p;
	    pi_beg = p+1;
        }
        else if(*p == ',') {	
	    *stat |= TOO_MANY_COMMA;
        }
	p++;
    } 
    if(!set_comm) *stat |= NO_COMMA; 
    if(!set_paren) { 
	*stat |= NO_TRAIL_PAREN; 
	pi_end = p;
	pi_end--;
	while(isspace((int)*pi_end))pi_end--;
	pi_end++;
    }
	    
    nchar = pi_end - card ; 
    strncpy(kvalue,card,nchar);
    *(kvalue+nchar) = '\0'; 
    while(isspace((int)*p)&& *p != '\0')  p++; 
    *pt = *pt + (p - card); 

    /* analyse the real and imagine part */ 
    *pr_end = '\0';
    *pi_end = '\0'; 
    while(isspace((int)*pr_beg) && *pr_beg != '\0')  pr_beg++; 
    while(isspace((int)*pi_beg) && *pi_beg != '\0')  pi_beg++; 
    temp[0] = '\0';
    pp = &pr_beg;
    get_num(pp, temp, &rtype, &tr); 
    if(tr)*stat |= BAD_REAL; 
    temp[0] = '\0';
    pp = &pi_beg;
    get_num(pp, temp, &itype, &ti); 
    if(ti)*stat |= BAD_IMG; 
    if(rtype == FLT_KEY || itype == FLT_KEY) *ktype = CMF_KEY;
    return;
}